

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O1

void __thiscall hwtest::pgraph::MthdCelsiusVtxAttrFloat::emulate_mthd(MthdCelsiusVtxAttrFloat *this)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    uVar1 = this->which;
    uVar3 = (ulong)(int)uVar1;
    if ((uVar3 < 5) && ((0x1aU >> (uVar1 & 0x1f) & 1) != 0)) {
      if ((*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 < 1) &&
         ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
          chipset.chipset != 0x10)) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_xfrm[uVar3 - 7]
        [1] = 0;
      }
      if (*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 < 2) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_xfrm[uVar3 - 7]
        [2] = 0;
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx
        [(int)(uVar1 * 4 | 3)] = 0x3f800000;
      }
    }
    iVar2 = 0xb;
    if (uVar1 != 7) {
      iVar2 = uVar1 * 4 + *(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914;
    }
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx[iVar2] =
         (this->super_SingleMthdTest).super_MthdTest.val;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		if (!extr(exp.nsource, 1, 1)) {
			if (which == 1 || which == 3 || which == 4) {
				if (idx < 1 && chipset.chipset != 0x10)
					exp.celsius_pipe_vtx[which * 4 + 1] = 0;
				if (idx < 2) {
					exp.celsius_pipe_vtx[which * 4 + 2] = 0;
					exp.celsius_pipe_vtx[which * 4 + 3] = 0x3f800000;
				}
			}
			exp.celsius_pipe_vtx[which == 7 ? 11 : which * 4 + idx] = val;
		}
	}